

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O2

Error __thiscall asmjit::v1_14::BaseRAPass::updateStackFrame(BaseRAPass *this)

{
  FuncFrame *frame;
  byte bVar1;
  uint32_t offset;
  FuncNode *pFVar2;
  byte bVar3;
  Error EVar4;
  undefined8 in_RAX;
  uint *puVar5;
  byte bVar6;
  Iterator __begin2;
  RegGroup group_00;
  RegGroup group;
  undefined8 uStack_38;
  
  pFVar2 = this->_func;
  frame = &pFVar2->_frame;
  uStack_38 = in_RAX;
  for (group_00 = k0; group_00 != kPC; group_00 = group_00 + kVec) {
    uStack_38 = CONCAT17(group_00,(undefined7)uStack_38);
    puVar5 = Support::Array<unsigned_int,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                       (&(this->_clobberedRegs)._masks,(RegGroup *)((long)&uStack_38 + 7));
    FuncFrame::addDirtyRegs(frame,group_00,*puVar5);
  }
  bVar3 = (byte)*(undefined4 *)&this->field_0x208;
  (pFVar2->_frame)._localStackAlignment = bVar3;
  bVar1 = (pFVar2->_frame)._naturalStackAlignment;
  bVar6 = (pFVar2->_frame)._callStackAlignment;
  if (bVar6 < bVar1) {
    bVar6 = bVar1;
  }
  if (bVar6 <= bVar3) {
    bVar6 = bVar3;
  }
  (pFVar2->_frame)._finalStackAlignment = bVar6;
  if ((this->_numStackArgsToStackSlots != 0) && (EVar4 = _markStackArgsToKeep(this), EVar4 != 0)) {
    return EVar4;
  }
  EVar4 = RAStackAllocator::calculateStackFrame(&this->_stackAllocator);
  if (EVar4 == 0) {
    (pFVar2->_frame)._localStackSize = *(uint32_t *)&this->field_0x204;
    EVar4 = FuncArgsAssignment::updateFuncFrame(&this->_argsAssignment,frame);
    if ((EVar4 == 0) && (EVar4 = FuncFrame::finalize(frame), EVar4 == 0)) {
      offset = (pFVar2->_frame)._localStackOffset;
      if ((offset != 0) &&
         (EVar4 = RAStackAllocator::adjustSlotOffsets(&this->_stackAllocator,offset), EVar4 != 0)) {
        return EVar4;
      }
      if ((this->_numStackArgsToStackSlots != 0) && (EVar4 = _updateStackArgs(this), EVar4 != 0)) {
        return EVar4;
      }
      EVar4 = 0;
    }
  }
  return EVar4;
}

Assistant:

Error BaseRAPass::updateStackFrame() noexcept {
  // Update some StackFrame information that we updated during allocation. The only information we don't have at the
  // moment is final local stack size, which is calculated last.
  FuncFrame& frame = func()->frame();
  for (RegGroup group : RegGroupVirtValues{})
    frame.addDirtyRegs(group, _clobberedRegs[group]);
  frame.setLocalStackAlignment(_stackAllocator.alignment());

  // If there are stack arguments that are not assigned to registers upon entry and the function doesn't require
  // dynamic stack alignment we keep these arguments where they are. This will also mark all stack slots that match
  // these arguments as allocated.
  if (_numStackArgsToStackSlots)
    ASMJIT_PROPAGATE(_markStackArgsToKeep());

  // Calculate offsets of all stack slots and update StackSize to reflect the calculated local stack size.
  ASMJIT_PROPAGATE(_stackAllocator.calculateStackFrame());
  frame.setLocalStackSize(_stackAllocator.stackSize());

  // Update the stack frame based on `_argsAssignment` and finalize it. Finalization means to apply final calculation
  // to the stack layout.
  ASMJIT_PROPAGATE(_argsAssignment.updateFuncFrame(frame));
  ASMJIT_PROPAGATE(frame.finalize());

  // StackAllocator allocates all stots starting from [0], adjust them when necessary.
  if (frame.localStackOffset() != 0)
    ASMJIT_PROPAGATE(_stackAllocator.adjustSlotOffsets(int32_t(frame.localStackOffset())));

  // Again, if there are stack arguments allocated in function's stack we have to handle them. This handles all cases
  // (either regular or dynamic stack alignment).
  if (_numStackArgsToStackSlots)
    ASMJIT_PROPAGATE(_updateStackArgs());

  return kErrorOk;
}